

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

bool __thiscall Assimp::MD5::MD5Parser::ParseSection(MD5Parser *this,Section *out)

{
  char **out_00;
  pointer *ppEVar1;
  byte bVar2;
  iterator __position;
  pointer pEVar3;
  bool bVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  Element local_58;
  long local_48 [3];
  
  out->iLineNumber = this->lineNumber;
  out_00 = &this->buffer;
  pbVar7 = (byte *)this->buffer;
  while ((0x20 < (ulong)*pbVar7 || ((0x100003601U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))) {
    pbVar7 = pbVar7 + 1;
    *out_00 = (char *)pbVar7;
  }
  local_58.szStart = (char *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
  std::__cxx11::string::operator=((string *)&out->mName,(string *)&local_58);
  if ((long *)local_58.szStart != local_48) {
    operator_delete(local_58.szStart,local_48[0] + 1);
  }
  for (pcVar5 = *out_00; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
  }
  *out_00 = pcVar5;
  while( true ) {
    pbVar7 = (byte *)*out_00;
    bVar2 = *pbVar7;
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
    goto LAB_004500e9;
    if (bVar2 == 0x7b) break;
    pcVar8 = *out_00;
    pcVar5 = pcVar8 + 1;
    do {
      do {
        *out_00 = pcVar5;
        pbVar6 = (byte *)(pcVar5 + -1);
        pcVar8 = pcVar8 + 1;
        pcVar5 = pcVar5 + 1;
      } while (0x20 < (ulong)*pbVar6);
    } while ((0x100003601U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0);
    local_58.szStart = (char *)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pbVar7,pcVar8);
    std::__cxx11::string::operator=((string *)&out->mGlobalValue,(string *)&local_58);
    if ((long *)local_58.szStart != local_48) {
      operator_delete(local_58.szStart,local_48[0] + 1);
    }
  }
  this->buffer = (char *)(pbVar7 + 1);
  bVar4 = SkipSpacesAndLineEnd(this,(char *)(pbVar7 + 1),out_00);
  if (bVar4) {
    pcVar5 = *out_00;
    if (*pcVar5 != '}') {
      do {
        local_58.szStart = (char *)0x0;
        local_58.iLineNumber = 0;
        local_58._12_4_ = 0;
        __position._M_current =
             (out->mElements).
             super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out->mElements).
            super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::
          _M_realloc_insert<Assimp::MD5::Element>(&out->mElements,__position,&local_58);
        }
        else {
          (__position._M_current)->szStart = (char *)0x0;
          *(undefined8 *)&(__position._M_current)->iLineNumber = 0;
          ppEVar1 = &(out->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppEVar1 = *ppEVar1 + 1;
        }
        pEVar3 = (out->mElements).
                 super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pEVar3[-1].iLineNumber = this->lineNumber;
        pEVar3[-1].szStart = this->buffer;
        pbVar7 = (byte *)this->buffer;
        while( true ) {
          pbVar6 = pbVar7 + 1;
          bVar2 = *pbVar7;
          if (bVar2 - 0xc < 2) break;
          if (bVar2 == 0) goto LAB_004500c1;
          if (bVar2 == 10) break;
          *out_00 = (char *)pbVar6;
          pbVar7 = pbVar6;
        }
        this->lineNumber = this->lineNumber + 1;
        this->buffer = (char *)pbVar6;
        *pbVar7 = 0;
LAB_004500c1:
        bVar4 = SkipSpacesAndLineEnd(this,this->buffer,out_00);
        if (!bVar4) {
          return false;
        }
        pcVar5 = *out_00;
      } while (*pcVar5 != '}');
    }
    *out_00 = pcVar5 + 1;
    if (bVar4 != false) {
LAB_004500e9:
      bVar4 = SkipSpacesAndLineEnd(this,this->buffer,out_00);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool MD5Parser::ParseSection(Section& out)
{
    // store the current line number for use in error messages
    out.iLineNumber = lineNumber;

    // first parse the name of the section
    char* sz = buffer;
    while (!IsSpaceOrNewLine( *buffer))buffer++;
    out.mName = std::string(sz,(uintptr_t)(buffer-sz));
    SkipSpaces();

    bool running = true;
    while (running) {
        if ('{' == *buffer) {
            // it is a normal section so read all lines
            buffer++;
            bool run = true;
            while (run)
            {
                if (!SkipSpacesAndLineEnd()) {
                    return false; // seems this was the last section
                }
                if ('}' == *buffer) {
                    buffer++;
                    break;
                }

                out.mElements.push_back(Element());
                Element& elem = out.mElements.back();

                elem.iLineNumber = lineNumber;
                elem.szStart = buffer;

                // terminate the line with zero
                while (!IsLineEnd( *buffer))buffer++;
                if (*buffer) {
                    ++lineNumber;
                    *buffer++ = '\0';
                }
            }
            break;
        }
        else if (!IsSpaceOrNewLine(*buffer))    {
            // it is an element at global scope. Parse its value and go on
            sz = buffer;
            while (!IsSpaceOrNewLine( *buffer++));
            out.mGlobalValue = std::string(sz,(uintptr_t)(buffer-sz));
            continue;
        }
        break;
    }
    return SkipSpacesAndLineEnd();
}